

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O0

void TTD::SnapShot::InitializeForSnapshotCompare
               (SnapShot *snap1,SnapShot *snap2,TTDCompareMap *compareMap)

{
  SnapContext *pSVar1;
  bool bVar2;
  SnapPrimitiveValue *pSVar3;
  SlotArrayInfo *pSVar4;
  ScriptFunctionScopeInfo *pSVar5;
  FunctionBodyResolveInfo *pFVar6;
  SnapObject *pSVar7;
  SnapObject *local_2c0;
  undefined1 local_2b8 [8];
  Iterator iter_11;
  undefined1 local_288 [8];
  Iterator iter_10;
  undefined1 local_258 [8];
  Iterator iter_9;
  undefined1 local_228 [8];
  Iterator iter_8;
  undefined1 local_1f8 [8];
  Iterator iter_7;
  undefined1 local_1c8 [8];
  Iterator iter_6;
  undefined1 local_198 [8];
  Iterator iter_5;
  undefined1 local_168 [8];
  Iterator iter_4;
  undefined1 local_138 [8];
  Iterator iter_3;
  undefined1 local_108 [8];
  Iterator iter_2;
  uint local_d4;
  ulong uStack_d0;
  uint32 i_5;
  uint local_c4;
  ulong uStack_c0;
  uint32 i_4;
  uint local_b4;
  SnapContext *pSStack_b0;
  uint32 i_3;
  SnapContext *ctx_1;
  Iterator iter_1;
  uint local_74;
  ulong uStack_70;
  uint32 i_2;
  uint local_64;
  ulong uStack_60;
  uint32 i_1;
  uint local_54;
  SnapContext *pSStack_50;
  uint32 i;
  SnapContext *ctx;
  Iterator iter;
  TTDCompareMap *compareMap_local;
  SnapShot *snap2_local;
  SnapShot *snap1_local;
  
  iter.m_currEntry = (SnapContext *)compareMap;
  UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::GetIterator
            ((Iterator *)&ctx,&snap1->m_ctxList);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::IsValid
                      ((Iterator *)&ctx);
    if (!bVar2) break;
    pSStack_50 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::Current
                           ((Iterator *)&ctx);
    for (local_54 = 0; local_54 < pSStack_50->LoadedTopLevelScriptCount; local_54 = local_54 + 1) {
      uStack_60 = (ulong)pSStack_50->LoadedTopLevelScriptArray[local_54].TopLevelBodyCtr;
      JsUtil::
      BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::AddNew((BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)&iter.m_currEntry[3].ContextSRC,
               &pSStack_50->LoadedTopLevelScriptArray[local_54].ContextSpecificBodyPtrId,
               &stack0xffffffffffffffa0);
    }
    for (local_64 = 0; local_64 < pSStack_50->NewFunctionTopLevelScriptCount;
        local_64 = local_64 + 1) {
      uStack_70 = (ulong)pSStack_50->NewFunctionTopLevelScriptArray[local_64].TopLevelBodyCtr;
      JsUtil::
      BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::AddNew((BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)&iter.m_currEntry[3].EvalTopLevelScriptArray,
               &pSStack_50->NewFunctionTopLevelScriptArray[local_64].ContextSpecificBodyPtrId,
               &stack0xffffffffffffff90);
    }
    for (local_74 = 0; local_74 < pSStack_50->EvalTopLevelScriptCount; local_74 = local_74 + 1) {
      iter_1.m_currEntry =
           (SnapContext *)(ulong)pSStack_50->EvalTopLevelScriptArray[local_74].TopLevelBodyCtr;
      JsUtil::
      BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::AddNew((BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)&iter.m_currEntry[4].ContextSRC,
               &pSStack_50->EvalTopLevelScriptArray[local_74].ContextSpecificBodyPtrId,
               (unsigned_long *)&iter_1.m_currEntry);
    }
    UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::MoveNext((Iterator *)&ctx);
  }
  UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::GetIterator
            ((Iterator *)&ctx_1,&snap2->m_ctxList);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::IsValid
                      ((Iterator *)&ctx_1);
    if (!bVar2) break;
    pSStack_b0 = UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::Current
                           ((Iterator *)&ctx_1);
    for (local_b4 = 0; local_b4 < pSStack_b0->LoadedTopLevelScriptCount; local_b4 = local_b4 + 1) {
      uStack_c0 = (ulong)pSStack_b0->LoadedTopLevelScriptArray[local_b4].TopLevelBodyCtr;
      JsUtil::
      BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::AddNew((BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)&iter.m_currEntry[7].EvalTopLevelScriptArray,
               &pSStack_b0->LoadedTopLevelScriptArray[local_b4].ContextSpecificBodyPtrId,
               &stack0xffffffffffffff40);
    }
    for (local_c4 = 0; local_c4 < pSStack_b0->NewFunctionTopLevelScriptCount;
        local_c4 = local_c4 + 1) {
      uStack_d0 = (ulong)pSStack_b0->NewFunctionTopLevelScriptArray[local_c4].TopLevelBodyCtr;
      JsUtil::
      BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::AddNew((BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)&iter.m_currEntry[8].ContextSRC,
               &pSStack_b0->NewFunctionTopLevelScriptArray[local_c4].ContextSpecificBodyPtrId,
               &stack0xffffffffffffff30);
    }
    for (local_d4 = 0; local_d4 < pSStack_b0->EvalTopLevelScriptCount; local_d4 = local_d4 + 1) {
      iter_2.m_currEntry =
           (SnapPrimitiveValue *)
           (ulong)pSStack_b0->EvalTopLevelScriptArray[local_d4].TopLevelBodyCtr;
      JsUtil::
      BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::AddNew((BaseDictionary<unsigned_long,_unsigned_long,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                *)&iter.m_currEntry[8].EvalTopLevelScriptArray,
               &pSStack_b0->EvalTopLevelScriptArray[local_d4].ContextSpecificBodyPtrId,
               (unsigned_long *)&iter_2.m_currEntry);
    }
    UnorderedArrayList<TTD::NSSnapValues::SnapContext,_32UL>::Iterator::MoveNext((Iterator *)&ctx_1)
    ;
  }
  UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::GetIterator
            ((Iterator *)local_108,&snap1->m_primitiveObjectList);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::Iterator::IsValid
                      ((Iterator *)local_108);
    if (!bVar2) break;
    pSVar1 = iter.m_currEntry + 1;
    pSVar3 = UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::Iterator::Current
                       ((Iterator *)local_108);
    iter_3.m_currEntry =
         UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::Iterator::Current
                   ((Iterator *)local_108);
    JsUtil::
    BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::SnapPrimitiveValue_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew((BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::SnapPrimitiveValue_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)&pSVar1->EvalTopLevelScriptArray,&pSVar3->PrimitiveValueId,&iter_3.m_currEntry);
    UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::Iterator::MoveNext
              ((Iterator *)local_108);
  }
  UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::GetIterator
            ((Iterator *)local_138,&snap2->m_primitiveObjectList);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::Iterator::IsValid
                      ((Iterator *)local_138);
    if (!bVar2) break;
    pSVar1 = iter.m_currEntry + 6;
    pSVar3 = UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::Iterator::Current
                       ((Iterator *)local_138);
    iter_4.m_currEntry =
         (SlotArrayInfo *)
         UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::Iterator::Current
                   ((Iterator *)local_138);
    JsUtil::
    BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::SnapPrimitiveValue_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew((BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::SnapPrimitiveValue_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)&pSVar1->ContextSRC,&pSVar3->PrimitiveValueId,
             (SnapPrimitiveValue **)&iter_4.m_currEntry);
    UnorderedArrayList<TTD::NSSnapValues::SnapPrimitiveValue,_4096UL>::Iterator::MoveNext
              ((Iterator *)local_138);
  }
  UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::GetIterator
            ((Iterator *)local_168,&snap1->m_slotArrayEntries);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Iterator::IsValid
                      ((Iterator *)local_168);
    if (!bVar2) break;
    pSVar1 = iter.m_currEntry + 2;
    pSVar4 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Iterator::Current
                       ((Iterator *)local_168);
    iter_5.m_currEntry =
         UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Iterator::Current
                   ((Iterator *)local_168);
    JsUtil::
    BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::SlotArrayInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew((BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::SlotArrayInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)&pSVar1->ContextSRC,&pSVar4->SlotId,&iter_5.m_currEntry);
    UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Iterator::MoveNext
              ((Iterator *)local_168);
  }
  UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::GetIterator
            ((Iterator *)local_198,&snap2->m_slotArrayEntries);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Iterator::IsValid
                      ((Iterator *)local_198);
    if (!bVar2) break;
    pSVar1 = iter.m_currEntry + 6;
    pSVar4 = UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Iterator::Current
                       ((Iterator *)local_198);
    iter_6.m_currEntry =
         (ScriptFunctionScopeInfo *)
         UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Iterator::Current
                   ((Iterator *)local_198);
    JsUtil::
    BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::SlotArrayInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew((BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::SlotArrayInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)&pSVar1->EvalTopLevelScriptArray,&pSVar4->SlotId,
             (SlotArrayInfo **)&iter_6.m_currEntry);
    UnorderedArrayList<TTD::NSSnapValues::SlotArrayInfo,_2048UL>::Iterator::MoveNext
              ((Iterator *)local_198);
  }
  UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::GetIterator
            ((Iterator *)local_1c8,&snap1->m_scopeEntries);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::
            IsValid((Iterator *)local_1c8);
    if (!bVar2) break;
    pSVar1 = iter.m_currEntry + 2;
    pSVar5 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::
             Current((Iterator *)local_1c8);
    iter_7.m_currEntry =
         UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::Current
                   ((Iterator *)local_1c8);
    JsUtil::
    BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::ScriptFunctionScopeInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew((BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::ScriptFunctionScopeInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)&pSVar1->EvalTopLevelScriptArray,&pSVar5->ScopeId,&iter_7.m_currEntry);
    UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::MoveNext
              ((Iterator *)local_1c8);
  }
  UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::GetIterator
            ((Iterator *)local_1f8,&snap2->m_scopeEntries);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::
            IsValid((Iterator *)local_1f8);
    if (!bVar2) break;
    pSVar1 = iter.m_currEntry + 7;
    pSVar5 = UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::
             Current((Iterator *)local_1f8);
    iter_8.m_currEntry =
         (FunctionBodyResolveInfo *)
         UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::Current
                   ((Iterator *)local_1f8);
    JsUtil::
    BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::ScriptFunctionScopeInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew((BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::ScriptFunctionScopeInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)&pSVar1->ContextSRC,&pSVar5->ScopeId,(ScriptFunctionScopeInfo **)&iter_8.m_currEntry
            );
    UnorderedArrayList<TTD::NSSnapValues::ScriptFunctionScopeInfo,_2048UL>::Iterator::MoveNext
              ((Iterator *)local_1f8);
  }
  UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::GetIterator
            ((Iterator *)local_228,&snap1->m_functionBodyList);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::
            IsValid((Iterator *)local_228);
    if (!bVar2) break;
    pSVar1 = iter.m_currEntry + 4;
    pFVar6 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::
             Current((Iterator *)local_228);
    iter_9.m_currEntry =
         UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::Current
                   ((Iterator *)local_228);
    JsUtil::
    BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::FunctionBodyResolveInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew((BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::FunctionBodyResolveInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)&pSVar1->EvalTopLevelScriptArray,&pFVar6->FunctionBodyId,&iter_9.m_currEntry);
    UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::MoveNext
              ((Iterator *)local_228);
  }
  UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::GetIterator
            ((Iterator *)local_258,&snap2->m_functionBodyList);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::
            IsValid((Iterator *)local_258);
    if (!bVar2) break;
    pSVar1 = iter.m_currEntry + 9;
    pFVar6 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::
             Current((Iterator *)local_258);
    iter_10.m_currEntry =
         (SnapObject *)
         UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::Current
                   ((Iterator *)local_258);
    JsUtil::
    BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::FunctionBodyResolveInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew((BaseDictionary<unsigned_long,_const_TTD::NSSnapValues::FunctionBodyResolveInfo_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)&pSVar1->ContextSRC,&pFVar6->FunctionBodyId,
             (FunctionBodyResolveInfo **)&iter_10.m_currEntry);
    UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Iterator::MoveNext
              ((Iterator *)local_258);
  }
  UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::GetIterator
            ((Iterator *)local_288,&snap1->m_compoundObjectList);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::IsValid
                      ((Iterator *)local_288);
    if (!bVar2) break;
    pSVar1 = iter.m_currEntry + 5;
    pSVar7 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::Current
                       ((Iterator *)local_288);
    iter_11.m_currEntry =
         UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::Current
                   ((Iterator *)local_288);
    JsUtil::
    BaseDictionary<unsigned_long,_const_TTD::NSSnapObjects::SnapObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew((BaseDictionary<unsigned_long,_const_TTD::NSSnapObjects::SnapObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)&pSVar1->ContextSRC,&pSVar7->ObjectPtrId,&iter_11.m_currEntry);
    UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::MoveNext
              ((Iterator *)local_288);
  }
  UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::GetIterator
            ((Iterator *)local_2b8,&snap2->m_compoundObjectList);
  while( true ) {
    bVar2 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::IsValid
                      ((Iterator *)local_2b8);
    if (!bVar2) break;
    pSVar1 = iter.m_currEntry + 9;
    pSVar7 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::Current
                       ((Iterator *)local_2b8);
    local_2c0 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::Current
                          ((Iterator *)local_2b8);
    JsUtil::
    BaseDictionary<unsigned_long,_const_TTD::NSSnapObjects::SnapObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew((BaseDictionary<unsigned_long,_const_TTD::NSSnapObjects::SnapObject_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              *)&pSVar1->EvalTopLevelScriptArray,&pSVar7->ObjectPtrId,&local_2c0);
    UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Iterator::MoveNext
              ((Iterator *)local_2b8);
  }
  return;
}

Assistant:

void SnapShot::InitializeForSnapshotCompare(const SnapShot* snap1, const SnapShot* snap2, TTDCompareMap& compareMap)
    {
        ////
        //Initialize all of the maps

        //top-level functions
        for(auto iter = snap1->m_ctxList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapContext* ctx = iter.Current();

            for(uint32 i = 0; i < ctx->LoadedTopLevelScriptCount; ++i)
            {
                compareMap.H1FunctionTopLevelLoadMap.AddNew(ctx->LoadedTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->LoadedTopLevelScriptArray[i].TopLevelBodyCtr);
            }

            for(uint32 i = 0; i < ctx->NewFunctionTopLevelScriptCount; ++i)
            {
                compareMap.H1FunctionTopLevelNewMap.AddNew(ctx->NewFunctionTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->NewFunctionTopLevelScriptArray[i].TopLevelBodyCtr);
            }

            for(uint32 i = 0; i < ctx->EvalTopLevelScriptCount; ++i)
            {
                compareMap.H1FunctionTopLevelEvalMap.AddNew(ctx->EvalTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->EvalTopLevelScriptArray[i].TopLevelBodyCtr);
            }
        }

        for(auto iter = snap2->m_ctxList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapContext* ctx = iter.Current();

            for(uint32 i = 0; i < ctx->LoadedTopLevelScriptCount; ++i)
            {
                compareMap.H2FunctionTopLevelLoadMap.AddNew(ctx->LoadedTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->LoadedTopLevelScriptArray[i].TopLevelBodyCtr);
            }

            for(uint32 i = 0; i < ctx->NewFunctionTopLevelScriptCount; ++i)
            {
                compareMap.H2FunctionTopLevelNewMap.AddNew(ctx->NewFunctionTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->NewFunctionTopLevelScriptArray[i].TopLevelBodyCtr);
            }

            for(uint32 i = 0; i < ctx->EvalTopLevelScriptCount; ++i)
            {
                compareMap.H2FunctionTopLevelEvalMap.AddNew(ctx->EvalTopLevelScriptArray[i].ContextSpecificBodyPtrId, ctx->EvalTopLevelScriptArray[i].TopLevelBodyCtr);
            }
        }

        //Values and things
        for(auto iter = snap1->m_primitiveObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1ValueMap.AddNew(iter.Current()->PrimitiveValueId, iter.Current());
        }

        for(auto iter = snap2->m_primitiveObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2ValueMap.AddNew(iter.Current()->PrimitiveValueId, iter.Current());
        }

        for(auto iter = snap1->m_slotArrayEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1SlotArrayMap.AddNew(iter.Current()->SlotId, iter.Current());
        }

        for(auto iter = snap2->m_slotArrayEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2SlotArrayMap.AddNew(iter.Current()->SlotId, iter.Current());
        }

        for(auto iter = snap1->m_scopeEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1FunctionScopeInfoMap.AddNew(iter.Current()->ScopeId, iter.Current());
        }

        for(auto iter = snap2->m_scopeEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2FunctionScopeInfoMap.AddNew(iter.Current()->ScopeId, iter.Current());
        }

        //Bodies and objects
        for(auto iter = snap1->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1FunctionBodyMap.AddNew(iter.Current()->FunctionBodyId, iter.Current());
        }

        for(auto iter = snap2->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2FunctionBodyMap.AddNew(iter.Current()->FunctionBodyId, iter.Current());
        }

        for(auto iter = snap1->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H1ObjectMap.AddNew(iter.Current()->ObjectPtrId, iter.Current());
        }

        for(auto iter = snap2->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            compareMap.H2ObjectMap.AddNew(iter.Current()->ObjectPtrId, iter.Current());
        }
    }